

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  float *pfVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  Geometry *pGVar9;
  RTCIntersectArguments *pRVar10;
  RTCRayQueryContext *pRVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  byte bVar28;
  int iVar29;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined4 uVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [32];
  float fVar70;
  undefined1 auVar71 [16];
  undefined8 uVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 in_ZMM21 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong *local_27f8;
  int local_27dc;
  RTCFilterFunctionNArguments local_27d8;
  ulong local_27a8;
  ulong local_27a0;
  long local_2798;
  ulong local_2790;
  ulong local_2788;
  ulong local_2780;
  ulong local_2778;
  ulong local_2770;
  ulong local_2768;
  long local_2760;
  Scene *local_2758;
  float local_2750;
  undefined4 local_274c;
  undefined4 local_2748;
  undefined4 local_2744;
  undefined4 local_2740;
  undefined4 local_273c;
  uint local_2738;
  uint local_2734;
  uint local_2730;
  undefined1 local_2720 [32];
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  uint uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar39 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2398[0] = 0;
    if (local_23a0 != 8) {
      aVar8 = (ray->super_RayK<1>).dir.field_0;
      auVar13 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar14 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar37._8_4_ = 0x7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar37._12_4_ = 0x7fffffff;
      auVar37 = vandps_avx512vl((undefined1  [16])aVar8,auVar37);
      auVar38._8_4_ = 0x219392ef;
      auVar38._0_8_ = 0x219392ef219392ef;
      auVar38._12_4_ = 0x219392ef;
      uVar34 = vcmpps_avx512vl(auVar37,auVar38,1);
      local_27f8 = local_2390;
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = &DAT_3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      auVar37 = vdivps_avx(auVar71,(undefined1  [16])aVar8);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar12 = (bool)((byte)uVar34 & 1);
      auVar39._0_4_ = (uint)bVar12 * auVar38._0_4_ | (uint)!bVar12 * auVar37._0_4_;
      bVar12 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar12 * auVar38._4_4_ | (uint)!bVar12 * auVar37._4_4_;
      bVar12 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar12 * auVar38._8_4_ | (uint)!bVar12 * auVar37._8_4_;
      bVar12 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar12 * auVar38._12_4_ | (uint)!bVar12 * auVar37._12_4_;
      auVar40._8_4_ = 0x3f7ffffa;
      auVar40._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar40._12_4_ = 0x3f7ffffa;
      auVar40 = vmulps_avx512vl(auVar39,auVar40);
      auVar41._8_4_ = 0x3f800003;
      auVar41._0_8_ = 0x3f8000033f800003;
      auVar41._12_4_ = 0x3f800003;
      auVar41 = vmulps_avx512vl(auVar39,auVar41);
      uVar66 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_25c0._4_4_ = uVar66;
      local_25c0._0_4_ = uVar66;
      local_25c0._8_4_ = uVar66;
      local_25c0._12_4_ = uVar66;
      local_25c0._16_4_ = uVar66;
      local_25c0._20_4_ = uVar66;
      local_25c0._24_4_ = uVar66;
      local_25c0._28_4_ = uVar66;
      auVar77 = ZEXT3264(local_25c0);
      uVar66 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_25e0._4_4_ = uVar66;
      local_25e0._0_4_ = uVar66;
      local_25e0._8_4_ = uVar66;
      local_25e0._12_4_ = uVar66;
      local_25e0._16_4_ = uVar66;
      local_25e0._20_4_ = uVar66;
      local_25e0._24_4_ = uVar66;
      local_25e0._28_4_ = uVar66;
      auVar79 = ZEXT3264(local_25e0);
      uVar66 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2600._4_4_ = uVar66;
      local_2600._0_4_ = uVar66;
      local_2600._8_4_ = uVar66;
      local_2600._12_4_ = uVar66;
      local_2600._16_4_ = uVar66;
      local_2600._20_4_ = uVar66;
      local_2600._24_4_ = uVar66;
      local_2600._28_4_ = uVar66;
      auVar80 = ZEXT3264(local_2600);
      fVar70 = auVar40._0_4_;
      local_2620._4_4_ = fVar70;
      local_2620._0_4_ = fVar70;
      local_2620._8_4_ = fVar70;
      local_2620._12_4_ = fVar70;
      local_2620._16_4_ = fVar70;
      local_2620._20_4_ = fVar70;
      local_2620._24_4_ = fVar70;
      local_2620._28_4_ = fVar70;
      auVar81 = ZEXT3264(local_2620);
      auVar37 = vmovshdup_avx(auVar40);
      uVar72 = auVar37._0_8_;
      local_2640._8_8_ = uVar72;
      local_2640._0_8_ = uVar72;
      local_2640._16_8_ = uVar72;
      local_2640._24_8_ = uVar72;
      auVar82 = ZEXT3264(local_2640);
      auVar46._8_4_ = 2;
      auVar46._0_8_ = 0x200000002;
      auVar46._12_4_ = 2;
      auVar46._16_4_ = 2;
      auVar46._20_4_ = 2;
      auVar46._24_4_ = 2;
      auVar46._28_4_ = 2;
      auVar38 = vshufpd_avx(auVar40,auVar40,1);
      local_2660 = vpermps_avx2(auVar46,ZEXT1632(auVar40));
      auVar84 = ZEXT3264(local_2660);
      uVar66 = auVar41._0_4_;
      local_2680._4_4_ = uVar66;
      local_2680._0_4_ = uVar66;
      local_2680._8_4_ = uVar66;
      local_2680._12_4_ = uVar66;
      local_2680._16_4_ = uVar66;
      local_2680._20_4_ = uVar66;
      local_2680._24_4_ = uVar66;
      local_2680._28_4_ = uVar66;
      auVar87 = ZEXT3264(local_2680);
      auVar42._8_4_ = 1;
      auVar42._0_8_ = 0x100000001;
      auVar42._12_4_ = 1;
      auVar42._16_4_ = 1;
      auVar42._20_4_ = 1;
      auVar42._24_4_ = 1;
      auVar42._28_4_ = 1;
      local_26a0 = vpermps_avx2(auVar42,ZEXT1632(auVar41));
      auVar89 = ZEXT3264(local_26a0);
      local_26c0 = vpermps_avx512vl(auVar46,ZEXT1632(auVar41));
      auVar90 = ZEXT3264(local_26c0);
      local_2768 = (ulong)(fVar70 < 0.0) << 5;
      local_2770 = (ulong)(auVar37._0_4_ < 0.0) << 5 | 0x40;
      local_2778 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x80;
      local_2780 = local_2768 ^ 0x20;
      uVar34 = local_2770 ^ 0x20;
      local_2788 = uVar34;
      local_2790 = local_2778 ^ 0x20;
      local_26e0 = vbroadcastss_avx512vl(auVar13);
      auVar91 = ZEXT3264(local_26e0);
      uVar66 = auVar14._0_4_;
      auVar68 = ZEXT3264(CONCAT428(uVar66,CONCAT424(uVar66,CONCAT420(uVar66,CONCAT416(uVar66,
                                                  CONCAT412(uVar66,CONCAT48(uVar66,CONCAT44(uVar66,
                                                  uVar66))))))));
      auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar92 = ZEXT3264(auVar42);
      auVar42 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar93 = ZEXT3264(auVar42);
      do {
        do {
          do {
            if (local_27f8 == &local_23a0) {
              return;
            }
            pfVar7 = (float *)(local_27f8 + -1);
            local_27f8 = local_27f8 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar7);
          uVar36 = *local_27f8;
          do {
            auVar47 = auVar80._0_32_;
            auVar46 = auVar79._0_32_;
            auVar42 = auVar77._0_32_;
            if ((uVar36 & 8) == 0) {
              auVar48 = vsubps_avx(*(undefined1 (*) [32])(uVar36 + 0x40 + local_2768),auVar42);
              auVar43._4_4_ = auVar81._4_4_ * auVar48._4_4_;
              auVar43._0_4_ = auVar81._0_4_ * auVar48._0_4_;
              auVar43._8_4_ = auVar81._8_4_ * auVar48._8_4_;
              auVar43._12_4_ = auVar81._12_4_ * auVar48._12_4_;
              auVar43._16_4_ = auVar81._16_4_ * auVar48._16_4_;
              auVar43._20_4_ = auVar81._20_4_ * auVar48._20_4_;
              auVar43._24_4_ = auVar81._24_4_ * auVar48._24_4_;
              auVar43._28_4_ = auVar48._28_4_;
              auVar48 = vsubps_avx(*(undefined1 (*) [32])(uVar36 + 0x40 + local_2770),auVar46);
              auVar44._4_4_ = auVar82._4_4_ * auVar48._4_4_;
              auVar44._0_4_ = auVar82._0_4_ * auVar48._0_4_;
              auVar44._8_4_ = auVar82._8_4_ * auVar48._8_4_;
              auVar44._12_4_ = auVar82._12_4_ * auVar48._12_4_;
              auVar44._16_4_ = auVar82._16_4_ * auVar48._16_4_;
              auVar44._20_4_ = auVar82._20_4_ * auVar48._20_4_;
              auVar44._24_4_ = auVar82._24_4_ * auVar48._24_4_;
              auVar44._28_4_ = auVar48._28_4_;
              auVar48 = vmaxps_avx(auVar43,auVar44);
              auVar43 = vsubps_avx(*(undefined1 (*) [32])(uVar36 + 0x40 + local_2778),auVar47);
              auVar45._4_4_ = auVar84._4_4_ * auVar43._4_4_;
              auVar45._0_4_ = auVar84._0_4_ * auVar43._0_4_;
              auVar45._8_4_ = auVar84._8_4_ * auVar43._8_4_;
              auVar45._12_4_ = auVar84._12_4_ * auVar43._12_4_;
              auVar45._16_4_ = auVar84._16_4_ * auVar43._16_4_;
              auVar45._20_4_ = auVar84._20_4_ * auVar43._20_4_;
              auVar45._24_4_ = auVar84._24_4_ * auVar43._24_4_;
              auVar45._28_4_ = auVar43._28_4_;
              auVar43 = vmaxps_avx512vl(auVar45,auVar91._0_32_);
              auVar44 = vmaxps_avx512vl(auVar48,auVar43);
              in_ZMM21 = ZEXT3264(auVar44);
              auVar48 = vsubps_avx(*(undefined1 (*) [32])(uVar36 + 0x40 + local_2780),auVar42);
              auVar49._4_4_ = auVar87._4_4_ * auVar48._4_4_;
              auVar49._0_4_ = auVar87._0_4_ * auVar48._0_4_;
              auVar49._8_4_ = auVar87._8_4_ * auVar48._8_4_;
              auVar49._12_4_ = auVar87._12_4_ * auVar48._12_4_;
              auVar49._16_4_ = auVar87._16_4_ * auVar48._16_4_;
              auVar49._20_4_ = auVar87._20_4_ * auVar48._20_4_;
              auVar49._24_4_ = auVar87._24_4_ * auVar48._24_4_;
              auVar49._28_4_ = auVar48._28_4_;
              auVar48 = vsubps_avx(*(undefined1 (*) [32])(uVar36 + 0x40 + local_2788),auVar46);
              auVar50._4_4_ = auVar89._4_4_ * auVar48._4_4_;
              auVar50._0_4_ = auVar89._0_4_ * auVar48._0_4_;
              auVar50._8_4_ = auVar89._8_4_ * auVar48._8_4_;
              auVar50._12_4_ = auVar89._12_4_ * auVar48._12_4_;
              auVar50._16_4_ = auVar89._16_4_ * auVar48._16_4_;
              auVar50._20_4_ = auVar89._20_4_ * auVar48._20_4_;
              auVar50._24_4_ = auVar89._24_4_ * auVar48._24_4_;
              auVar50._28_4_ = auVar48._28_4_;
              auVar48 = vminps_avx(auVar49,auVar50);
              auVar43 = vsubps_avx(*(undefined1 (*) [32])(uVar36 + 0x40 + local_2790),auVar47);
              auVar43 = vmulps_avx512vl(auVar90._0_32_,auVar43);
              auVar43 = vminps_avx(auVar43,auVar68._0_32_);
              auVar48 = vminps_avx(auVar48,auVar43);
              uVar72 = vcmpps_avx512vl(auVar44,auVar48,2);
              uVar34 = CONCAT44((int)(uVar34 >> 0x20),(uint)(byte)uVar72);
            }
            if ((uVar36 & 8) == 0) {
              if (uVar34 == 0) {
                iVar29 = 4;
              }
              else {
                auVar48 = *(undefined1 (*) [32])(uVar36 & 0xfffffffffffffff0);
                auVar43 = ((undefined1 (*) [32])(uVar36 & 0xfffffffffffffff0))[1];
                auVar44 = vmovdqa64_avx512vl(auVar92._0_32_);
                auVar49 = in_ZMM21._0_32_;
                auVar44 = vpternlogd_avx512vl(auVar44,auVar49,auVar93._0_32_,0xf8);
                uVar36 = uVar34 & 0xffffffff;
                auVar45 = vpcompressd_avx512vl(auVar44);
                bVar12 = (bool)((byte)uVar36 & 1);
                auVar51._0_4_ = (uint)bVar12 * auVar45._0_4_ | (uint)!bVar12 * auVar44._0_4_;
                bVar12 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar51._4_4_ = (uint)bVar12 * auVar45._4_4_ | (uint)!bVar12 * auVar44._4_4_;
                bVar12 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar51._8_4_ = (uint)bVar12 * auVar45._8_4_ | (uint)!bVar12 * auVar44._8_4_;
                bVar12 = (bool)((byte)(uVar36 >> 3) & 1);
                auVar51._12_4_ = (uint)bVar12 * auVar45._12_4_ | (uint)!bVar12 * auVar44._12_4_;
                bVar12 = (bool)((byte)(uVar36 >> 4) & 1);
                auVar51._16_4_ = (uint)bVar12 * auVar45._16_4_ | (uint)!bVar12 * auVar44._16_4_;
                bVar12 = (bool)((byte)(uVar36 >> 5) & 1);
                auVar51._20_4_ = (uint)bVar12 * auVar45._20_4_ | (uint)!bVar12 * auVar44._20_4_;
                bVar12 = (bool)((byte)(uVar36 >> 6) & 1);
                auVar51._24_4_ = (uint)bVar12 * auVar45._24_4_ | (uint)!bVar12 * auVar44._24_4_;
                bVar12 = (bool)((byte)(uVar36 >> 7) & 1);
                auVar51._28_4_ = (uint)bVar12 * auVar45._28_4_ | (uint)!bVar12 * auVar44._28_4_;
                auVar44 = vpermt2q_avx512vl(auVar48,auVar51,auVar43);
                uVar36 = auVar44._0_8_;
                iVar29 = 0;
                uVar32 = uVar34 - 1 & uVar34;
                if (uVar32 != 0) {
                  auVar44 = vpshufd_avx2(auVar51,0x55);
                  vpermt2q_avx512vl(auVar48,auVar44,auVar43);
                  auVar45 = vpminsd_avx2(auVar51,auVar44);
                  auVar44 = vpmaxsd_avx2(auVar51,auVar44);
                  uVar32 = uVar32 - 1 & uVar32;
                  if (uVar32 == 0) {
                    auVar42 = vpermi2q_avx512vl(auVar45,auVar48,auVar43);
                    uVar36 = auVar42._0_8_;
                    auVar42 = vpermt2q_avx512vl(auVar48,auVar44,auVar43);
                    *local_27f8 = auVar42._0_8_;
                    auVar42 = vpermd_avx512vl(auVar44,auVar49);
                    *(int *)(local_27f8 + 1) = auVar42._0_4_;
                    local_27f8 = local_27f8 + 2;
                  }
                  else {
                    auVar52 = vpshufd_avx2(auVar51,0xaa);
                    vpermt2q_avx512vl(auVar48,auVar52,auVar43);
                    auVar50 = vpminsd_avx2(auVar45,auVar52);
                    auVar45 = vpmaxsd_avx2(auVar45,auVar52);
                    auVar52 = vpminsd_avx2(auVar44,auVar45);
                    auVar44 = vpmaxsd_avx2(auVar44,auVar45);
                    uVar32 = uVar32 - 1 & uVar32;
                    if (uVar32 == 0) {
                      auVar42 = vpermi2q_avx512vl(auVar50,auVar48,auVar43);
                      uVar36 = auVar42._0_8_;
                      auVar42 = vpermt2q_avx512vl(auVar48,auVar44,auVar43);
                      *local_27f8 = auVar42._0_8_;
                      auVar42 = vpermd_avx512vl(auVar44,auVar49);
                      *(int *)(local_27f8 + 1) = auVar42._0_4_;
                      auVar42 = vpermt2q_avx512vl(auVar48,auVar52,auVar43);
                      local_27f8[2] = auVar42._0_8_;
                      auVar42 = vpermd_avx512vl(auVar52,auVar49);
                      *(int *)(local_27f8 + 3) = auVar42._0_4_;
                      local_27f8 = local_27f8 + 4;
                    }
                    else {
                      auVar60 = vmovdqa64_avx512vl(auVar49);
                      auVar62 = vmovdqa64_avx512vl(auVar93._0_32_);
                      auVar61 = vmovdqa64_avx512vl(auVar92._0_32_);
                      auVar45 = vpshufd_avx2(auVar51,0xff);
                      vpermt2q_avx512vl(auVar48,auVar45,auVar43);
                      auVar49 = vpminsd_avx2(auVar50,auVar45);
                      auVar45 = vpmaxsd_avx2(auVar50,auVar45);
                      auVar50 = vpminsd_avx2(auVar52,auVar45);
                      auVar45 = vpmaxsd_avx2(auVar52,auVar45);
                      auVar52 = vpminsd_avx2(auVar44,auVar45);
                      auVar44 = vpmaxsd_avx2(auVar44,auVar45);
                      uVar32 = uVar32 - 1 & uVar32;
                      if (uVar32 == 0) {
                        auVar45 = vpermi2q_avx512vl(auVar49,auVar48,auVar43);
                        uVar36 = auVar45._0_8_;
                        auVar45 = vpermt2q_avx512vl(auVar48,auVar44,auVar43);
                        *local_27f8 = auVar45._0_8_;
                        auVar45 = vmovdqa64_avx512vl(auVar60);
                        auVar44 = vpermd_avx512vl(auVar44,auVar60);
                        *(int *)(local_27f8 + 1) = auVar44._0_4_;
                        auVar44 = vpermt2q_avx512vl(auVar48,auVar52,auVar43);
                        local_27f8[2] = auVar44._0_8_;
                        auVar44 = vpermd_avx512vl(auVar52,auVar60);
                        *(int *)(local_27f8 + 3) = auVar44._0_4_;
                        auVar48 = vpermt2q_avx512vl(auVar48,auVar50,auVar43);
                        local_27f8[4] = auVar48._0_8_;
                        auVar48 = vpermd_avx512vl(auVar50,auVar60);
                        *(int *)(local_27f8 + 5) = auVar48._0_4_;
                        local_27f8 = local_27f8 + 6;
                        auVar48 = vmovdqa64_avx512vl(auVar61);
                        auVar43 = vmovdqa64_avx512vl(auVar62);
                      }
                      else {
                        auVar51 = valignd_avx512vl(auVar51,auVar51,3);
                        auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                        auVar49 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                       CONCAT48(0x80000000,
                                                                                0x8000000080000000))
                                                            ),auVar45,auVar49);
                        auVar45 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                        auVar49 = vpermt2d_avx512vl(auVar49,auVar45,auVar50);
                        auVar49 = vpermt2d_avx512vl(auVar49,auVar45,auVar52);
                        auVar45 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar44 = vpermt2d_avx512vl(auVar49,auVar45,auVar44);
                        auVar77 = ZEXT3264(auVar44);
                        uVar36 = uVar32;
                        do {
                          auVar45 = auVar77._0_32_;
                          auVar53._8_4_ = 1;
                          auVar53._0_8_ = 0x100000001;
                          auVar53._12_4_ = 1;
                          auVar53._16_4_ = 1;
                          auVar53._20_4_ = 1;
                          auVar53._24_4_ = 1;
                          auVar53._28_4_ = 1;
                          auVar44 = vpermd_avx2(auVar53,auVar51);
                          auVar51 = valignd_avx512vl(auVar51,auVar51,1);
                          vpermt2q_avx512vl(auVar48,auVar51,auVar43);
                          uVar36 = uVar36 - 1 & uVar36;
                          uVar72 = vpcmpd_avx512vl(auVar44,auVar45,5);
                          auVar44 = vpmaxsd_avx2(auVar44,auVar45);
                          bVar28 = (byte)uVar72 << 1;
                          auVar45 = valignd_avx512vl(auVar45,auVar45,7);
                          bVar12 = (bool)((byte)uVar72 & 1);
                          auVar52._4_4_ =
                               (uint)bVar12 * auVar45._4_4_ | (uint)!bVar12 * auVar44._4_4_;
                          auVar52._0_4_ = auVar44._0_4_;
                          bVar12 = (bool)(bVar28 >> 2 & 1);
                          auVar52._8_4_ =
                               (uint)bVar12 * auVar45._8_4_ | (uint)!bVar12 * auVar44._8_4_;
                          bVar12 = (bool)(bVar28 >> 3 & 1);
                          auVar52._12_4_ =
                               (uint)bVar12 * auVar45._12_4_ | (uint)!bVar12 * auVar44._12_4_;
                          bVar12 = (bool)(bVar28 >> 4 & 1);
                          auVar52._16_4_ =
                               (uint)bVar12 * auVar45._16_4_ | (uint)!bVar12 * auVar44._16_4_;
                          bVar12 = (bool)(bVar28 >> 5 & 1);
                          auVar52._20_4_ =
                               (uint)bVar12 * auVar45._20_4_ | (uint)!bVar12 * auVar44._20_4_;
                          bVar12 = (bool)(bVar28 >> 6 & 1);
                          auVar52._24_4_ =
                               (uint)bVar12 * auVar45._24_4_ | (uint)!bVar12 * auVar44._24_4_;
                          auVar52._28_4_ =
                               (uint)(bVar28 >> 7) * auVar45._28_4_ |
                               (uint)!(bool)(bVar28 >> 7) * auVar44._28_4_;
                          auVar77 = ZEXT3264(auVar52);
                        } while (uVar36 != 0);
                        lVar33 = POPCOUNT(uVar32) + 3;
                        do {
                          auVar44 = vpermi2q_avx512vl(auVar52,auVar48,auVar43);
                          *local_27f8 = auVar44._0_8_;
                          auVar45 = auVar77._0_32_;
                          auVar44 = vpermd_avx512vl(auVar45,auVar60);
                          *(int *)(local_27f8 + 1) = auVar44._0_4_;
                          auVar52 = valignd_avx512vl(auVar45,auVar45,1);
                          local_27f8 = local_27f8 + 2;
                          auVar77 = ZEXT3264(auVar52);
                          lVar33 = lVar33 + -1;
                        } while (lVar33 != 0);
                        auVar48 = vpermt2q_avx512vl(auVar48,auVar52,auVar43);
                        uVar36 = auVar48._0_8_;
                        auVar48 = vmovdqa64_avx512vl(auVar61);
                        auVar43 = vmovdqa64_avx512vl(auVar62);
                        auVar45 = vmovdqa64_avx512vl(auVar60);
                      }
                      in_ZMM21 = ZEXT3264(auVar45);
                      auVar93 = ZEXT3264(auVar43);
                      auVar92 = ZEXT3264(auVar48);
                      auVar91 = ZEXT3264(auVar91._0_32_);
                      auVar90 = ZEXT3264(auVar90._0_32_);
                      auVar89 = ZEXT3264(auVar89._0_32_);
                      auVar87 = ZEXT3264(auVar87._0_32_);
                      auVar84 = ZEXT3264(auVar84._0_32_);
                      auVar82 = ZEXT3264(auVar82._0_32_);
                      auVar81 = ZEXT3264(auVar81._0_32_);
                      auVar80 = ZEXT3264(auVar47);
                      auVar79 = ZEXT3264(auVar46);
                      auVar77 = ZEXT3264(auVar42);
                      iVar29 = 0;
                    }
                  }
                }
              }
            }
            else {
              iVar29 = 6;
            }
          } while (iVar29 == 0);
        } while (iVar29 != 6);
        local_25a0 = in_ZMM21._0_32_;
        local_2798 = (ulong)((uint)uVar36 & 0xf) - 8;
        if (local_2798 != 0) {
          uVar36 = uVar36 & 0xfffffffffffffff0;
          local_2760 = 0;
          local_27a0 = uVar34;
          local_27a8 = uVar36;
          do {
            lVar30 = local_2760 * 0xe0;
            lVar33 = uVar36 + 0xd0 + lVar30;
            local_2700 = *(undefined8 *)(lVar33 + 0x10);
            uStack_26f8 = *(undefined8 *)(lVar33 + 0x18);
            lVar33 = uVar36 + 0xc0 + lVar30;
            local_2580 = *(undefined8 *)(lVar33 + 0x10);
            uStack_2578 = *(undefined8 *)(lVar33 + 0x18);
            uStack_2570 = local_2580;
            uStack_2568 = uStack_2578;
            uStack_26f0 = local_2700;
            uStack_26e8 = uStack_26f8;
            auVar54._16_16_ = *(undefined1 (*) [16])(uVar36 + 0x60 + lVar30);
            auVar54._0_16_ = *(undefined1 (*) [16])(uVar36 + lVar30);
            auVar55._16_16_ = *(undefined1 (*) [16])(uVar36 + 0x70 + lVar30);
            auVar55._0_16_ = *(undefined1 (*) [16])(uVar36 + 0x10 + lVar30);
            auVar56._16_16_ = *(undefined1 (*) [16])(uVar36 + 0x80 + lVar30);
            auVar56._0_16_ = *(undefined1 (*) [16])(uVar36 + 0x20 + lVar30);
            auVar37 = *(undefined1 (*) [16])(uVar36 + 0x30 + lVar30);
            auVar57._16_16_ = auVar37;
            auVar57._0_16_ = auVar37;
            auVar37 = *(undefined1 (*) [16])(uVar36 + 0x40 + lVar30);
            auVar58._16_16_ = auVar37;
            auVar58._0_16_ = auVar37;
            auVar37 = *(undefined1 (*) [16])(uVar36 + 0x50 + lVar30);
            auVar59._16_16_ = auVar37;
            auVar59._0_16_ = auVar37;
            auVar37 = *(undefined1 (*) [16])(uVar36 + 0x90 + lVar30);
            auVar64._16_16_ = auVar37;
            auVar64._0_16_ = auVar37;
            auVar37 = *(undefined1 (*) [16])(uVar36 + 0xa0 + lVar30);
            auVar83._16_16_ = auVar37;
            auVar83._0_16_ = auVar37;
            auVar37 = *(undefined1 (*) [16])(uVar36 + 0xb0 + lVar30);
            auVar85._16_16_ = auVar37;
            auVar85._0_16_ = auVar37;
            uVar66 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar88._4_4_ = uVar66;
            auVar88._0_4_ = uVar66;
            auVar88._8_4_ = uVar66;
            auVar88._12_4_ = uVar66;
            auVar88._16_4_ = uVar66;
            auVar88._20_4_ = uVar66;
            auVar88._24_4_ = uVar66;
            auVar88._28_4_ = uVar66;
            auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]))
            ;
            auVar47 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar66 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar73._4_4_ = uVar66;
            auVar73._0_4_ = uVar66;
            auVar73._8_4_ = uVar66;
            auVar73._12_4_ = uVar66;
            auVar73._16_4_ = uVar66;
            auVar73._20_4_ = uVar66;
            auVar73._24_4_ = uVar66;
            auVar73._28_4_ = uVar66;
            uVar66 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar75._4_4_ = uVar66;
            auVar75._0_4_ = uVar66;
            auVar75._8_4_ = uVar66;
            auVar75._12_4_ = uVar66;
            auVar75._16_4_ = uVar66;
            auVar75._20_4_ = uVar66;
            auVar75._24_4_ = uVar66;
            auVar75._28_4_ = uVar66;
            fVar70 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar78._4_4_ = fVar70;
            auVar78._0_4_ = fVar70;
            auVar78._8_4_ = fVar70;
            auVar78._12_4_ = fVar70;
            auVar78._16_4_ = fVar70;
            auVar78._20_4_ = fVar70;
            auVar78._24_4_ = fVar70;
            auVar78._28_4_ = fVar70;
            auVar42 = vsubps_avx(auVar54,auVar88);
            auVar43 = vsubps_avx512vl(auVar55,auVar46);
            auVar44 = vsubps_avx512vl(auVar56,auVar47);
            auVar48 = vsubps_avx512vl(auVar57,auVar88);
            auVar45 = vsubps_avx512vl(auVar58,auVar46);
            auVar49 = vsubps_avx512vl(auVar59,auVar47);
            auVar50 = vsubps_avx512vl(auVar64,auVar88);
            auVar51 = vsubps_avx512vl(auVar83,auVar46);
            auVar47 = vsubps_avx512vl(auVar85,auVar47);
            auVar52 = vsubps_avx512vl(auVar50,auVar42);
            auVar53 = vsubps_avx512vl(auVar51,auVar43);
            auVar46 = vsubps_avx(auVar47,auVar44);
            auVar54 = vsubps_avx512vl(auVar42,auVar48);
            auVar55 = vsubps_avx512vl(auVar43,auVar45);
            auVar56 = vsubps_avx512vl(auVar44,auVar49);
            auVar57 = vsubps_avx512vl(auVar48,auVar50);
            auVar58 = vsubps_avx512vl(auVar45,auVar51);
            auVar59 = vsubps_avx512vl(auVar49,auVar47);
            auVar60 = vaddps_avx512vl(auVar50,auVar42);
            auVar61 = vaddps_avx512vl(auVar51,auVar43);
            auVar62 = vaddps_avx512vl(auVar47,auVar44);
            auVar63 = vmulps_avx512vl(auVar61,auVar46);
            auVar63 = vfmsub231ps_avx512vl(auVar63,auVar53,auVar62);
            auVar62 = vmulps_avx512vl(auVar62,auVar52);
            auVar64 = vfmsub231ps_avx512vl(auVar62,auVar46,auVar60);
            auVar62._4_4_ = auVar53._4_4_ * auVar60._4_4_;
            auVar62._0_4_ = auVar53._0_4_ * auVar60._0_4_;
            auVar62._8_4_ = auVar53._8_4_ * auVar60._8_4_;
            auVar62._12_4_ = auVar53._12_4_ * auVar60._12_4_;
            auVar62._16_4_ = auVar53._16_4_ * auVar60._16_4_;
            auVar62._20_4_ = auVar53._20_4_ * auVar60._20_4_;
            auVar62._24_4_ = auVar53._24_4_ * auVar60._24_4_;
            auVar62._28_4_ = auVar60._28_4_;
            auVar37 = vfmsub231ps_fma(auVar62,auVar52,auVar61);
            auVar69._0_4_ = fVar70 * auVar37._0_4_;
            auVar69._4_4_ = fVar70 * auVar37._4_4_;
            auVar69._8_4_ = fVar70 * auVar37._8_4_;
            auVar69._12_4_ = fVar70 * auVar37._12_4_;
            auVar69._16_4_ = fVar70 * 0.0;
            auVar69._20_4_ = fVar70 * 0.0;
            auVar69._24_4_ = fVar70 * 0.0;
            auVar69._28_4_ = 0;
            auVar60 = vfmadd231ps_avx512vl(auVar69,auVar75,auVar64);
            local_2560 = vfmadd231ps_avx512vl(auVar60,auVar73,auVar63);
            auVar60 = vaddps_avx512vl(auVar42,auVar48);
            auVar62 = vaddps_avx512vl(auVar43,auVar45);
            auVar61 = vaddps_avx512vl(auVar44,auVar49);
            auVar63 = vmulps_avx512vl(auVar62,auVar56);
            auVar63 = vfmsub231ps_avx512vl(auVar63,auVar55,auVar61);
            auVar61 = vmulps_avx512vl(auVar61,auVar54);
            auVar64 = vfmsub231ps_avx512vl(auVar61,auVar56,auVar60);
            auVar60 = vmulps_avx512vl(auVar60,auVar55);
            auVar60 = vfmsub231ps_avx512vl(auVar60,auVar54,auVar62);
            auVar61._4_4_ = fVar70 * auVar60._4_4_;
            auVar61._0_4_ = fVar70 * auVar60._0_4_;
            auVar61._8_4_ = fVar70 * auVar60._8_4_;
            auVar61._12_4_ = fVar70 * auVar60._12_4_;
            auVar61._16_4_ = fVar70 * auVar60._16_4_;
            auVar61._20_4_ = fVar70 * auVar60._20_4_;
            auVar61._24_4_ = fVar70 * auVar60._24_4_;
            auVar61._28_4_ = auVar60._28_4_;
            auVar60 = vfmadd231ps_avx512vl(auVar61,auVar75,auVar64);
            local_2540 = vfmadd231ps_avx512vl(auVar60,auVar73,auVar63);
            auVar48 = vaddps_avx512vl(auVar48,auVar50);
            auVar45 = vaddps_avx512vl(auVar45,auVar51);
            auVar47 = vaddps_avx512vl(auVar49,auVar47);
            auVar49 = vmulps_avx512vl(auVar45,auVar59);
            auVar49 = vfmsub231ps_avx512vl(auVar49,auVar58,auVar47);
            auVar63._4_4_ = auVar47._4_4_ * auVar57._4_4_;
            auVar63._0_4_ = auVar47._0_4_ * auVar57._0_4_;
            auVar63._8_4_ = auVar47._8_4_ * auVar57._8_4_;
            auVar63._12_4_ = auVar47._12_4_ * auVar57._12_4_;
            auVar63._16_4_ = auVar47._16_4_ * auVar57._16_4_;
            auVar63._20_4_ = auVar47._20_4_ * auVar57._20_4_;
            auVar63._24_4_ = auVar47._24_4_ * auVar57._24_4_;
            auVar63._28_4_ = auVar47._28_4_;
            auVar47 = vfmsub231ps_avx512vl(auVar63,auVar59,auVar48);
            auVar48 = vmulps_avx512vl(auVar48,auVar58);
            auVar48 = vfmsub231ps_avx512vl(auVar48,auVar57,auVar45);
            auVar48 = vmulps_avx512vl(auVar78,auVar48);
            auVar47 = vfmadd231ps_avx512vl(auVar48,auVar75,auVar47);
            auVar45 = vfmadd231ps_avx512vl(auVar47,auVar73,auVar49);
            auVar86._0_4_ = local_2540._0_4_ + local_2560._0_4_;
            auVar86._4_4_ = local_2540._4_4_ + local_2560._4_4_;
            auVar86._8_4_ = local_2540._8_4_ + local_2560._8_4_;
            auVar86._12_4_ = local_2540._12_4_ + local_2560._12_4_;
            auVar86._16_4_ = local_2540._16_4_ + local_2560._16_4_;
            auVar86._20_4_ = local_2540._20_4_ + local_2560._20_4_;
            auVar86._24_4_ = local_2540._24_4_ + local_2560._24_4_;
            auVar86._28_4_ = local_2540._28_4_ + local_2560._28_4_;
            local_2520 = vaddps_avx512vl(auVar45,auVar86);
            auVar47._8_4_ = 0x7fffffff;
            auVar47._0_8_ = 0x7fffffff7fffffff;
            auVar47._12_4_ = 0x7fffffff;
            auVar47._16_4_ = 0x7fffffff;
            auVar47._20_4_ = 0x7fffffff;
            auVar47._24_4_ = 0x7fffffff;
            auVar47._28_4_ = 0x7fffffff;
            vandps_avx512vl(local_2520,auVar47);
            auVar48._8_4_ = 0x34000000;
            auVar48._0_8_ = 0x3400000034000000;
            auVar48._12_4_ = 0x34000000;
            auVar48._16_4_ = 0x34000000;
            auVar48._20_4_ = 0x34000000;
            auVar48._24_4_ = 0x34000000;
            auVar48._28_4_ = 0x34000000;
            auVar47 = vmulps_avx512vl(local_2520,auVar48);
            auVar48 = vminps_avx512vl(local_2560,local_2540);
            auVar48 = vminps_avx512vl(auVar48,auVar45);
            auVar60._8_4_ = 0x80000000;
            auVar60._0_8_ = 0x8000000080000000;
            auVar60._12_4_ = 0x80000000;
            auVar60._16_4_ = 0x80000000;
            auVar60._20_4_ = 0x80000000;
            auVar60._24_4_ = 0x80000000;
            auVar60._28_4_ = 0x80000000;
            auVar49 = vxorps_avx512vl(auVar47,auVar60);
            uVar72 = vcmpps_avx512vl(auVar48,auVar49,5);
            auVar48 = vmaxps_avx512vl(local_2560,local_2540);
            auVar48 = vmaxps_avx512vl(auVar48,auVar45);
            uVar15 = vcmpps_avx512vl(auVar48,auVar47,2);
            local_24a0 = (byte)uVar72 | (byte)uVar15;
            if (local_24a0 != 0) {
              auVar47 = vmulps_avx512vl(auVar46,auVar55);
              auVar48 = vmulps_avx512vl(auVar52,auVar56);
              auVar45 = vmulps_avx512vl(auVar53,auVar54);
              auVar49 = vmulps_avx512vl(auVar56,auVar58);
              auVar50 = vmulps_avx512vl(auVar54,auVar59);
              auVar51 = vmulps_avx512vl(auVar55,auVar57);
              auVar60 = vfmsub213ps_avx512vl(auVar53,auVar56,auVar47);
              auVar46 = vfmsub213ps_avx512vl(auVar46,auVar54,auVar48);
              auVar52 = vfmsub213ps_avx512vl(auVar52,auVar55,auVar45);
              auVar62 = vfmsub213ps_avx512vl(auVar59,auVar55,auVar49);
              auVar61 = vfmsub213ps_avx512vl(auVar57,auVar56,auVar50);
              auVar53 = vfmsub213ps_avx512vl(auVar58,auVar54,auVar51);
              auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(auVar47,auVar63);
              vandps_avx512vl(auVar49,auVar63);
              uVar32 = vcmpps_avx512vl(auVar63,auVar63,1);
              vandps_avx512vl(auVar48,auVar63);
              vandps_avx512vl(auVar50,auVar63);
              uVar16 = vcmpps_avx512vl(auVar63,auVar63,1);
              vandps_avx512vl(auVar45,auVar63);
              vandps_avx512vl(auVar51,auVar63);
              uVar17 = vcmpps_avx512vl(auVar63,auVar63,1);
              bVar12 = (bool)((byte)uVar32 & 1);
              local_2500._0_4_ =
                   (float)((uint)bVar12 * auVar60._0_4_ | (uint)!bVar12 * auVar62._0_4_);
              bVar12 = (bool)((byte)(uVar32 >> 1) & 1);
              local_2500._4_4_ =
                   (float)((uint)bVar12 * auVar60._4_4_ | (uint)!bVar12 * auVar62._4_4_);
              bVar12 = (bool)((byte)(uVar32 >> 2) & 1);
              local_2500._8_4_ =
                   (float)((uint)bVar12 * auVar60._8_4_ | (uint)!bVar12 * auVar62._8_4_);
              bVar12 = (bool)((byte)(uVar32 >> 3) & 1);
              local_2500._12_4_ =
                   (float)((uint)bVar12 * auVar60._12_4_ | (uint)!bVar12 * auVar62._12_4_);
              bVar12 = (bool)((byte)(uVar32 >> 4) & 1);
              local_2500._16_4_ =
                   (float)((uint)bVar12 * auVar60._16_4_ | (uint)!bVar12 * auVar62._16_4_);
              bVar12 = (bool)((byte)(uVar32 >> 5) & 1);
              local_2500._20_4_ =
                   (float)((uint)bVar12 * auVar60._20_4_ | (uint)!bVar12 * auVar62._20_4_);
              bVar12 = (bool)((byte)(uVar32 >> 6) & 1);
              local_2500._24_4_ =
                   (float)((uint)bVar12 * auVar60._24_4_ | (uint)!bVar12 * auVar62._24_4_);
              bVar12 = SUB81(uVar32 >> 7,0);
              local_2500._28_4_ = (uint)bVar12 * auVar60._28_4_ | (uint)!bVar12 * auVar62._28_4_;
              bVar12 = (bool)((byte)uVar16 & 1);
              local_24e0._0_4_ =
                   (float)((uint)bVar12 * auVar46._0_4_ | (uint)!bVar12 * auVar61._0_4_);
              bVar12 = (bool)((byte)(uVar16 >> 1) & 1);
              local_24e0._4_4_ =
                   (float)((uint)bVar12 * auVar46._4_4_ | (uint)!bVar12 * auVar61._4_4_);
              bVar12 = (bool)((byte)(uVar16 >> 2) & 1);
              local_24e0._8_4_ =
                   (float)((uint)bVar12 * auVar46._8_4_ | (uint)!bVar12 * auVar61._8_4_);
              bVar12 = (bool)((byte)(uVar16 >> 3) & 1);
              local_24e0._12_4_ =
                   (float)((uint)bVar12 * auVar46._12_4_ | (uint)!bVar12 * auVar61._12_4_);
              bVar12 = (bool)((byte)(uVar16 >> 4) & 1);
              local_24e0._16_4_ =
                   (float)((uint)bVar12 * auVar46._16_4_ | (uint)!bVar12 * auVar61._16_4_);
              bVar12 = (bool)((byte)(uVar16 >> 5) & 1);
              local_24e0._20_4_ =
                   (float)((uint)bVar12 * auVar46._20_4_ | (uint)!bVar12 * auVar61._20_4_);
              bVar12 = (bool)((byte)(uVar16 >> 6) & 1);
              local_24e0._24_4_ =
                   (float)((uint)bVar12 * auVar46._24_4_ | (uint)!bVar12 * auVar61._24_4_);
              bVar12 = SUB81(uVar16 >> 7,0);
              local_24e0._28_4_ = (uint)bVar12 * auVar46._28_4_ | (uint)!bVar12 * auVar61._28_4_;
              bVar12 = (bool)((byte)uVar17 & 1);
              local_24c0 = (float)((uint)bVar12 * auVar52._0_4_ | (uint)!bVar12 * auVar53._0_4_);
              bVar12 = (bool)((byte)(uVar17 >> 1) & 1);
              fStack_24bc = (float)((uint)bVar12 * auVar52._4_4_ | (uint)!bVar12 * auVar53._4_4_);
              bVar12 = (bool)((byte)(uVar17 >> 2) & 1);
              fStack_24b8 = (float)((uint)bVar12 * auVar52._8_4_ | (uint)!bVar12 * auVar53._8_4_);
              bVar12 = (bool)((byte)(uVar17 >> 3) & 1);
              fStack_24b4 = (float)((uint)bVar12 * auVar52._12_4_ | (uint)!bVar12 * auVar53._12_4_);
              bVar12 = (bool)((byte)(uVar17 >> 4) & 1);
              fStack_24b0 = (float)((uint)bVar12 * auVar52._16_4_ | (uint)!bVar12 * auVar53._16_4_);
              bVar12 = (bool)((byte)(uVar17 >> 5) & 1);
              fStack_24ac = (float)((uint)bVar12 * auVar52._20_4_ | (uint)!bVar12 * auVar53._20_4_);
              bVar12 = (bool)((byte)(uVar17 >> 6) & 1);
              fStack_24a8 = (float)((uint)bVar12 * auVar52._24_4_ | (uint)!bVar12 * auVar53._24_4_);
              bVar12 = SUB81(uVar17 >> 7,0);
              uStack_24a4 = (uint)bVar12 * auVar52._28_4_ | (uint)!bVar12 * auVar53._28_4_;
              auVar25._4_4_ = fVar70 * fStack_24bc;
              auVar25._0_4_ = fVar70 * local_24c0;
              auVar25._8_4_ = fVar70 * fStack_24b8;
              auVar25._12_4_ = fVar70 * fStack_24b4;
              auVar25._16_4_ = fVar70 * fStack_24b0;
              auVar25._20_4_ = fVar70 * fStack_24ac;
              auVar25._24_4_ = fVar70 * fStack_24a8;
              auVar25._28_4_ = fVar70;
              auVar37 = vfmadd213ps_fma(auVar75,local_24e0,auVar25);
              auVar37 = vfmadd213ps_fma(auVar73,local_2500,ZEXT1632(auVar37));
              auVar47 = ZEXT1632(CONCAT412(auVar37._12_4_ + auVar37._12_4_,
                                           CONCAT48(auVar37._8_4_ + auVar37._8_4_,
                                                    CONCAT44(auVar37._4_4_ + auVar37._4_4_,
                                                             auVar37._0_4_ + auVar37._0_4_))));
              auVar76._0_4_ = auVar44._0_4_ * local_24c0;
              auVar76._4_4_ = auVar44._4_4_ * fStack_24bc;
              auVar76._8_4_ = auVar44._8_4_ * fStack_24b8;
              auVar76._12_4_ = auVar44._12_4_ * fStack_24b4;
              auVar76._16_4_ = auVar44._16_4_ * fStack_24b0;
              auVar76._20_4_ = auVar44._20_4_ * fStack_24ac;
              auVar76._24_4_ = auVar44._24_4_ * fStack_24a8;
              auVar76._28_4_ = 0;
              auVar37 = vfmadd213ps_fma(auVar43,local_24e0,auVar76);
              auVar13 = vfmadd213ps_fma(auVar42,local_2500,ZEXT1632(auVar37));
              auVar42 = vrcp14ps_avx512vl(auVar47);
              auVar19._8_4_ = 0x3f800000;
              auVar19._0_8_ = &DAT_3f8000003f800000;
              auVar19._12_4_ = 0x3f800000;
              auVar19._16_4_ = 0x3f800000;
              auVar19._20_4_ = 0x3f800000;
              auVar19._24_4_ = 0x3f800000;
              auVar19._28_4_ = 0x3f800000;
              auVar46 = vfnmadd213ps_avx512vl(auVar42,auVar47,auVar19);
              auVar37 = vfmadd132ps_fma(auVar46,auVar42,auVar42);
              local_2440 = ZEXT1632(CONCAT412((auVar13._12_4_ + auVar13._12_4_) * auVar37._12_4_,
                                              CONCAT48((auVar13._8_4_ + auVar13._8_4_) *
                                                       auVar37._8_4_,
                                                       CONCAT44((auVar13._4_4_ + auVar13._4_4_) *
                                                                auVar37._4_4_,
                                                                (auVar13._0_4_ + auVar13._0_4_) *
                                                                auVar37._0_4_))));
              uVar66 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar20._4_4_ = uVar66;
              auVar20._0_4_ = uVar66;
              auVar20._8_4_ = uVar66;
              auVar20._12_4_ = uVar66;
              auVar20._16_4_ = uVar66;
              auVar20._20_4_ = uVar66;
              auVar20._24_4_ = uVar66;
              auVar20._28_4_ = uVar66;
              uVar72 = vcmpps_avx512vl(local_2440,auVar20,0xd);
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar21._16_4_ = 0x80000000;
              auVar21._20_4_ = 0x80000000;
              auVar21._24_4_ = 0x80000000;
              auVar21._28_4_ = 0x80000000;
              auVar42 = vxorps_avx512vl(auVar47,auVar21);
              fVar70 = (ray->super_RayK<1>).tfar;
              auVar22._4_4_ = fVar70;
              auVar22._0_4_ = fVar70;
              auVar22._8_4_ = fVar70;
              auVar22._12_4_ = fVar70;
              auVar22._16_4_ = fVar70;
              auVar22._20_4_ = fVar70;
              auVar22._24_4_ = fVar70;
              auVar22._28_4_ = fVar70;
              uVar15 = vcmpps_avx512vl(local_2440,auVar22,2);
              uVar18 = vcmpps_avx512vl(auVar47,auVar42,4);
              local_24a0 = (byte)uVar72 & (byte)uVar15 & (byte)uVar18 & local_24a0;
              uVar35 = (uint)local_24a0;
              if (local_24a0 != 0) {
                local_23c0 = 0xf0;
                local_2758 = context->scene;
                auVar23._8_4_ = 0x219392ef;
                auVar23._0_8_ = 0x219392ef219392ef;
                auVar23._12_4_ = 0x219392ef;
                auVar23._16_4_ = 0x219392ef;
                auVar23._20_4_ = 0x219392ef;
                auVar23._24_4_ = 0x219392ef;
                auVar23._28_4_ = 0x219392ef;
                uVar34 = vcmpps_avx512vl(local_2520,auVar23,5);
                auVar46 = vrcp14ps_avx512vl(local_2520);
                auVar74._8_4_ = 0x3f800000;
                auVar74._0_8_ = &DAT_3f8000003f800000;
                auVar74._12_4_ = 0x3f800000;
                auVar74._16_4_ = 0x3f800000;
                auVar74._20_4_ = 0x3f800000;
                auVar74._24_4_ = 0x3f800000;
                auVar74._28_4_ = 0x3f800000;
                auVar37 = vfnmadd213ps_fma(local_2520,auVar46,auVar74);
                auVar42 = vfmadd132ps_avx512vl(ZEXT1632(auVar37),auVar46,auVar46);
                fVar1 = (float)((uint)((byte)uVar34 & 1) * auVar42._0_4_);
                fVar70 = (float)((uint)((byte)(uVar34 >> 1) & 1) * auVar42._4_4_);
                fVar2 = (float)((uint)((byte)(uVar34 >> 2) & 1) * auVar42._8_4_);
                fVar3 = (float)((uint)((byte)(uVar34 >> 3) & 1) * auVar42._12_4_);
                fVar4 = (float)((uint)((byte)(uVar34 >> 4) & 1) * auVar42._16_4_);
                fVar5 = (float)((uint)((byte)(uVar34 >> 5) & 1) * auVar42._20_4_);
                fVar6 = (float)((uint)((byte)(uVar34 >> 6) & 1) * auVar42._24_4_);
                auVar26._4_4_ = fVar70 * local_2560._4_4_;
                auVar26._0_4_ = fVar1 * local_2560._0_4_;
                auVar26._8_4_ = fVar2 * local_2560._8_4_;
                auVar26._12_4_ = fVar3 * local_2560._12_4_;
                auVar26._16_4_ = fVar4 * local_2560._16_4_;
                auVar26._20_4_ = fVar5 * local_2560._20_4_;
                auVar26._24_4_ = fVar6 * local_2560._24_4_;
                auVar26._28_4_ = local_2560._28_4_;
                auVar42 = vminps_avx(auVar26,auVar74);
                auVar27._4_4_ = local_2540._4_4_ * fVar70;
                auVar27._0_4_ = local_2540._0_4_ * fVar1;
                auVar27._8_4_ = local_2540._8_4_ * fVar2;
                auVar27._12_4_ = local_2540._12_4_ * fVar3;
                auVar27._16_4_ = local_2540._16_4_ * fVar4;
                auVar27._20_4_ = local_2540._20_4_ * fVar5;
                auVar27._24_4_ = local_2540._24_4_ * fVar6;
                auVar27._28_4_ = auVar46._28_4_;
                auVar46 = vminps_avx(auVar27,auVar74);
                auVar47 = vsubps_avx(auVar74,auVar42);
                auVar48 = vsubps_avx(auVar74,auVar46);
                local_2460 = vblendps_avx(auVar46,auVar47,0xf0);
                local_2480 = vblendps_avx(auVar42,auVar48,0xf0);
                fVar70 = (float)DAT_02060940;
                fVar2 = DAT_02060940._4_4_;
                fVar3 = DAT_02060940._8_4_;
                fVar1 = DAT_02060940._12_4_;
                fVar4 = DAT_02060940._16_4_;
                fVar5 = DAT_02060940._20_4_;
                fVar6 = DAT_02060940._24_4_;
                local_2420[0] = local_2500._0_4_ * fVar70;
                local_2420[1] = local_2500._4_4_ * fVar2;
                local_2420[2] = local_2500._8_4_ * fVar3;
                local_2420[3] = local_2500._12_4_ * fVar1;
                fStack_2410 = local_2500._16_4_ * fVar4;
                fStack_240c = local_2500._20_4_ * fVar5;
                fStack_2408 = local_2500._24_4_ * fVar6;
                uStack_2404 = local_2500._28_4_;
                local_2400[0] = local_24e0._0_4_ * fVar70;
                local_2400[1] = local_24e0._4_4_ * fVar2;
                local_2400[2] = local_24e0._8_4_ * fVar3;
                local_2400[3] = local_24e0._12_4_ * fVar1;
                fStack_23f0 = local_24e0._16_4_ * fVar4;
                fStack_23ec = local_24e0._20_4_ * fVar5;
                fStack_23e8 = local_24e0._24_4_ * fVar6;
                uStack_23e4 = local_24e0._28_4_;
                local_23e0[0] = local_24c0 * fVar70;
                local_23e0[1] = fStack_24bc * fVar2;
                local_23e0[2] = fStack_24b8 * fVar3;
                local_23e0[3] = fStack_24b4 * fVar1;
                fStack_23d0 = fStack_24b0 * fVar4;
                fStack_23cc = fStack_24ac * fVar5;
                fStack_23c8 = fStack_24a8 * fVar6;
                uStack_23c4 = uStack_24a4;
                auVar67._8_4_ = 0x7f800000;
                auVar67._0_8_ = 0x7f8000007f800000;
                auVar67._12_4_ = 0x7f800000;
                auVar67._16_4_ = 0x7f800000;
                auVar67._20_4_ = 0x7f800000;
                auVar67._24_4_ = 0x7f800000;
                auVar67._28_4_ = 0x7f800000;
                auVar42 = vblendmps_avx512vl(auVar67,local_2440);
                auVar65._0_4_ =
                     (uint)(local_24a0 & 1) * auVar42._0_4_ |
                     (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
                bVar12 = (bool)(local_24a0 >> 1 & 1);
                auVar65._4_4_ = (uint)bVar12 * auVar42._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)(local_24a0 >> 2 & 1);
                auVar65._8_4_ = (uint)bVar12 * auVar42._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)(local_24a0 >> 3 & 1);
                auVar65._12_4_ = (uint)bVar12 * auVar42._12_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)(local_24a0 >> 4 & 1);
                auVar65._16_4_ = (uint)bVar12 * auVar42._16_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)(local_24a0 >> 5 & 1);
                auVar65._20_4_ = (uint)bVar12 * auVar42._20_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)(local_24a0 >> 6 & 1);
                auVar65._24_4_ = (uint)bVar12 * auVar42._24_4_ | (uint)!bVar12 * 0x7f800000;
                auVar65._28_4_ =
                     (uint)(local_24a0 >> 7) * auVar42._28_4_ |
                     (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
                auVar42 = vshufps_avx(auVar65,auVar65,0xb1);
                auVar42 = vminps_avx(auVar65,auVar42);
                auVar46 = vshufpd_avx(auVar42,auVar42,5);
                auVar42 = vminps_avx(auVar42,auVar46);
                auVar46 = vpermpd_avx2(auVar42,0x4e);
                auVar42 = vminps_avx(auVar42,auVar46);
                uVar72 = vcmpps_avx512vl(auVar65,auVar42,0);
                uVar31 = uVar35;
                if (((byte)uVar72 & local_24a0) != 0) {
                  uVar31 = (uint)((byte)uVar72 & local_24a0);
                }
                bVar28 = 0;
                for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x80000000) {
                  bVar28 = bVar28 + 1;
                }
                local_2720 = local_2440;
                do {
                  uVar31 = *(uint *)((long)&local_2580 + (ulong)bVar28 * 4);
                  pGVar9 = (local_2758->geometries).items[uVar31].ptr;
                  if ((pGVar9->mask & (ray->super_RayK<1>).mask) == 0) {
                    uVar35 = (uint)(byte)(~(byte)(1 << (bVar28 & 0x1f)) & (byte)uVar35);
LAB_01fc96df:
                    bVar12 = true;
                  }
                  else {
                    pRVar10 = context->args;
                    if ((pRVar10->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      uVar34 = (ulong)((uint)bVar28 * 4);
                      local_27d8.context = context->user;
                      local_2750 = *(float *)((long)local_2420 + uVar34);
                      local_274c = *(undefined4 *)((long)local_2400 + uVar34);
                      local_2748 = *(undefined4 *)((long)local_23e0 + uVar34);
                      local_2744 = *(undefined4 *)(local_2480 + uVar34);
                      local_2740 = *(undefined4 *)(local_2460 + uVar34);
                      local_273c = *(undefined4 *)((long)&local_2700 + uVar34);
                      local_2738 = uVar31;
                      local_2734 = (local_27d8.context)->instID[0];
                      local_2730 = (local_27d8.context)->instPrimID[0];
                      fVar70 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar34);
                      local_27dc = -1;
                      local_27d8.valid = &local_27dc;
                      local_27d8.geometryUserPtr = pGVar9->userPtr;
                      local_27d8.ray = (RTCRayN *)ray;
                      local_27d8.hit = (RTCHitN *)&local_2750;
                      local_27d8.N = 1;
                      if ((pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar9->intersectionFilterN)(&local_27d8), *local_27d8.valid != 0)) {
                        if (pRVar10->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar10->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar10->filter)(&local_27d8);
                          }
                          if (*local_27d8.valid == 0) goto LAB_01fc98be;
                        }
                        (((Vec3f *)((long)local_27d8.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_27d8.hit;
                        (((Vec3f *)((long)local_27d8.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_27d8.hit + 4);
                        (((Vec3f *)((long)local_27d8.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_27d8.hit + 8);
                        *(float *)((long)local_27d8.ray + 0x3c) = *(float *)(local_27d8.hit + 0xc);
                        *(float *)((long)local_27d8.ray + 0x40) = *(float *)(local_27d8.hit + 0x10);
                        *(float *)((long)local_27d8.ray + 0x44) = *(float *)(local_27d8.hit + 0x14);
                        *(float *)((long)local_27d8.ray + 0x48) = *(float *)(local_27d8.hit + 0x18);
                        *(float *)((long)local_27d8.ray + 0x4c) = *(float *)(local_27d8.hit + 0x1c);
                        *(float *)((long)local_27d8.ray + 0x50) = *(float *)(local_27d8.hit + 0x20);
                      }
                      else {
LAB_01fc98be:
                        (ray->super_RayK<1>).tfar = fVar70;
                      }
                      fVar70 = (ray->super_RayK<1>).tfar;
                      auVar24._4_4_ = fVar70;
                      auVar24._0_4_ = fVar70;
                      auVar24._8_4_ = fVar70;
                      auVar24._12_4_ = fVar70;
                      auVar24._16_4_ = fVar70;
                      auVar24._20_4_ = fVar70;
                      auVar24._24_4_ = fVar70;
                      auVar24._28_4_ = fVar70;
                      uVar72 = vcmpps_avx512vl(local_2720,auVar24,2);
                      uVar35 = (uint)(byte)(~(byte)(1 << (bVar28 & 0x1f)) & (byte)uVar35) &
                               (uint)uVar72;
                      goto LAB_01fc96df;
                    }
                    bVar12 = false;
                  }
                  uVar36 = local_27a8;
                  uVar34 = local_27a0;
                  if (!bVar12) {
                    uVar32 = (ulong)bVar28;
                    lVar33 = uVar32 * 4;
                    fVar70 = *(float *)(local_2480 + lVar33);
                    fVar2 = *(float *)(local_2460 + lVar33);
                    (ray->super_RayK<1>).tfar = *(float *)(local_2440 + lVar33);
                    (ray->Ng).field_0.field_0.x = local_2420[uVar32];
                    (ray->Ng).field_0.field_0.y = local_2400[uVar32];
                    (ray->Ng).field_0.field_0.z = local_23e0[uVar32];
                    ray->u = fVar70;
                    ray->v = fVar2;
                    ray->primID = *(uint *)((long)&local_2700 + lVar33);
                    ray->geomID = uVar31;
                    pRVar11 = context->user;
                    ray->instID[0] = pRVar11->instID[0];
                    ray->instPrimID[0] = pRVar11->instPrimID[0];
                    break;
                  }
                  if ((char)uVar35 == '\0') break;
                  BVHNIntersector1<8,1,true,embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Pluecker<4,true>>>
                  ::intersect();
                  bVar28 = (byte)local_27d8.valid;
                } while( true );
              }
            }
            local_2760 = local_2760 + 1;
          } while (local_2760 != local_2798);
        }
        fVar70 = (ray->super_RayK<1>).tfar;
        auVar68 = ZEXT3264(CONCAT428(fVar70,CONCAT424(fVar70,CONCAT420(fVar70,CONCAT416(fVar70,
                                                  CONCAT412(fVar70,CONCAT48(fVar70,CONCAT44(fVar70,
                                                  fVar70))))))));
        auVar77 = ZEXT3264(local_25c0);
        auVar79 = ZEXT3264(local_25e0);
        auVar80 = ZEXT3264(local_2600);
        auVar81 = ZEXT3264(local_2620);
        auVar82 = ZEXT3264(local_2640);
        auVar84 = ZEXT3264(local_2660);
        auVar87 = ZEXT3264(local_2680);
        auVar89 = ZEXT3264(local_26a0);
        auVar90 = ZEXT3264(local_26c0);
        auVar91 = ZEXT3264(local_26e0);
        auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
        auVar92 = ZEXT3264(auVar42);
        auVar42 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
        auVar93 = ZEXT3264(auVar42);
        in_ZMM21 = ZEXT3264(local_25a0);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }